

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_sse2_128_16.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_striped_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ushort *puVar1;
  short *psVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int16_t iVar18;
  int16_t iVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  parasail_result_t *ppVar23;
  __m128i *palVar24;
  __m128i *ptr;
  __m128i *ptr_00;
  int16_t *ptr_01;
  int iVar25;
  uint uVar26;
  uint uVar27;
  long lVar28;
  ulong uVar29;
  int iVar30;
  int32_t segNum;
  ulong uVar31;
  long lVar32;
  undefined2 uVar33;
  uint uVar34;
  int iVar35;
  long lVar36;
  ulong uVar37;
  uint uVar38;
  long lVar39;
  __m128i *ptr_02;
  short sVar40;
  undefined4 uVar41;
  short sVar44;
  short sVar46;
  ulong uVar42;
  short sVar45;
  short sVar47;
  short sVar48;
  short sVar49;
  undefined1 auVar43 [16];
  short sVar50;
  undefined4 uVar51;
  short sVar66;
  ulong uVar53;
  undefined1 auVar54 [16];
  undefined4 uVar52;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  int iVar67;
  int iVar68;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  short sVar69;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  ushort uVar86;
  int iVar87;
  ushort uVar89;
  ushort uVar90;
  int iVar91;
  ushort uVar92;
  ushort uVar93;
  int iVar94;
  ushort uVar95;
  ushort uVar96;
  undefined1 auVar88 [16];
  int iVar97;
  ushort uVar98;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  ushort uVar102;
  ushort uVar106;
  ushort uVar107;
  ushort uVar108;
  ushort uVar109;
  ushort uVar110;
  ushort uVar111;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  ushort uVar113;
  undefined1 auVar105 [16];
  undefined1 auVar115 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  __m128i_16_t e;
  __m128i_16_t h;
  short local_88;
  short sStack_86;
  ushort local_78;
  ushort uStack_76;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  short sVar112;
  short sVar114;
  short sVar116;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_striped_profile_sse2_128_16_cold_8();
  }
  else {
    pvVar4 = (profile->profile16).score;
    if (pvVar4 == (void *)0x0) {
      parasail_sg_flags_striped_profile_sse2_128_16_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_striped_profile_sse2_128_16_cold_6();
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          parasail_sg_flags_striped_profile_sse2_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_striped_profile_sse2_128_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_striped_profile_sse2_128_16_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_striped_profile_sse2_128_16_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_striped_profile_sse2_128_16_cold_1();
        }
        else {
          uVar20 = uVar3 - 1;
          uVar31 = (ulong)uVar3 + 7 >> 3;
          uVar42 = (ulong)uVar20 % uVar31;
          iVar21 = (int)(uVar20 / uVar31);
          uVar34 = -open;
          uVar38 = ppVar5->min;
          iVar30 = -uVar38;
          if (uVar38 != uVar34 && SBORROW4(uVar38,uVar34) == (int)(uVar38 + open) < 0) {
            iVar30 = open;
          }
          iVar35 = ppVar5->max;
          ppVar23 = parasail_result_new();
          if (ppVar23 != (parasail_result_t *)0x0) {
            ppVar23->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar23->flag | 0x8200802;
            palVar24 = parasail_memalign___m128i(0x10,uVar31);
            ptr = parasail_memalign___m128i(0x10,uVar31);
            ptr_00 = parasail_memalign___m128i(0x10,uVar31);
            ptr_01 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
            auVar54._0_4_ = -(uint)((int)ptr_00 == 0);
            auVar54._4_4_ = -(uint)((int)((ulong)ptr_00 >> 0x20) == 0);
            auVar54._8_4_ = -(uint)((int)ptr_01 == 0);
            auVar54._12_4_ = -(uint)((int)((ulong)ptr_01 >> 0x20) == 0);
            auVar43._0_4_ = -(uint)((int)((ulong)palVar24 >> 0x20) == 0 && (int)palVar24 == 0);
            auVar43._4_4_ = -(uint)((int)ptr == 0 && (int)((ulong)ptr >> 0x20) == 0);
            auVar43._8_4_ = auVar54._0_4_ & auVar54._4_4_;
            auVar43._12_4_ = auVar54._8_4_ & auVar54._12_4_;
            iVar25 = movmskps((int)palVar24,auVar43);
            if (iVar25 == 0) {
              iVar25 = s2Len + -1;
              uVar26 = 7 - iVar21;
              auVar43 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
              uVar41 = auVar43._0_4_;
              auVar70._4_4_ = uVar41;
              auVar70._0_4_ = uVar41;
              auVar70._8_4_ = uVar41;
              auVar70._12_4_ = uVar41;
              auVar43 = pshuflw(auVar54,ZEXT416((uint)gap),0);
              uVar41 = auVar43._0_4_;
              uVar22 = iVar30 - 0x7fff;
              auVar43 = pshuflw(ZEXT416(uVar22),ZEXT416(uVar22),0);
              uVar51 = auVar43._0_4_;
              auVar54 = ZEXT416(CONCAT22((short)(uVar38 >> 0x10),0x7ffe - (short)iVar35));
              auVar54 = pshuflw(auVar54,auVar54,0);
              uVar52 = auVar54._0_4_;
              auVar71._4_4_ = uVar52;
              auVar71._0_4_ = uVar52;
              auVar71._8_4_ = uVar52;
              auVar71._12_4_ = uVar52;
              auVar55 = pshuflw(ZEXT416(uVar26),ZEXT416(uVar26),0);
              lVar39 = (long)(int)uVar34;
              uVar37 = 0;
              do {
                lVar32 = 0;
                lVar36 = lVar39;
                do {
                  lVar28 = lVar36;
                  if (s1_beg != 0) {
                    lVar28 = 0;
                  }
                  uVar33 = 0x8000;
                  if (-0x8000 < lVar28) {
                    uVar33 = (undefined2)lVar28;
                  }
                  *(undefined2 *)((long)&local_48 + lVar32 * 2) = uVar33;
                  lVar28 = lVar28 - (ulong)(uint)open;
                  if (lVar28 < -0x7fff) {
                    lVar28 = -0x8000;
                  }
                  *(short *)((long)&local_58 + lVar32 * 2) = (short)lVar28;
                  lVar32 = lVar32 + 1;
                  lVar36 = lVar36 - uVar31 * (uint)gap;
                } while (lVar32 != 8);
                palVar24[uVar37][0] = local_48;
                palVar24[uVar37][1] = lStack_40;
                ptr_00[uVar37][0] = local_58;
                ptr_00[uVar37][1] = lStack_50;
                uVar37 = uVar37 + 1;
                lVar39 = lVar39 - (ulong)(uint)gap;
              } while (uVar37 != uVar31);
              *ptr_01 = 0;
              auVar100 = _DAT_00904aa0;
              auVar64 = _DAT_00903aa0;
              lVar39 = (ulong)(uint)s2Len - 1;
              auVar88._8_4_ = (int)lVar39;
              auVar88._0_8_ = lVar39;
              auVar88._12_4_ = (int)((ulong)lVar39 >> 0x20);
              iVar35 = -gap;
              iVar30 = gap * 2;
              auVar88 = auVar88 ^ _DAT_00903aa0;
              uVar37 = 0;
              uVar38 = uVar34;
              do {
                uVar52 = (undefined4)uVar37;
                auVar117._8_4_ = uVar52;
                auVar117._0_8_ = uVar37;
                auVar117._12_4_ = (int)(uVar37 >> 0x20);
                auVar56 = (auVar117 | _DAT_00903a90) ^ auVar64;
                iVar87 = auVar88._0_4_;
                auVar76._0_4_ = -(uint)(iVar87 < auVar56._0_4_);
                iVar91 = auVar88._4_4_;
                auVar76._4_4_ = -(uint)(iVar91 < auVar56._4_4_);
                iVar94 = auVar88._8_4_;
                auVar76._8_4_ = -(uint)(iVar94 < auVar56._8_4_);
                iVar97 = auVar88._12_4_;
                auVar76._12_4_ = -(uint)(iVar97 < auVar56._12_4_);
                auVar125._4_4_ = auVar76._0_4_;
                auVar125._0_4_ = auVar76._0_4_;
                auVar125._8_4_ = auVar76._8_4_;
                auVar125._12_4_ = auVar76._8_4_;
                auVar119 = pshuflw(in_XMM11,auVar125,0xe8);
                iVar67 = -(uint)(auVar56._4_4_ == iVar91);
                iVar68 = -(uint)(auVar56._12_4_ == iVar97);
                auVar122._4_4_ = iVar67;
                auVar122._0_4_ = iVar67;
                auVar122._8_4_ = iVar68;
                auVar122._12_4_ = iVar68;
                auVar79 = pshuflw(auVar71,auVar122,0xe8);
                auVar123._4_4_ = auVar76._4_4_;
                auVar123._0_4_ = auVar76._4_4_;
                auVar123._8_4_ = auVar76._12_4_;
                auVar123._12_4_ = auVar76._12_4_;
                auVar71 = pshuflw(auVar76,auVar123,0xe8);
                auVar56._8_4_ = 0xffffffff;
                auVar56._0_8_ = 0xffffffffffffffff;
                auVar56._12_4_ = 0xffffffff;
                auVar56 = (auVar71 | auVar79 & auVar119) ^ auVar56;
                auVar71 = packssdw(auVar56,auVar56);
                uVar27 = gap * -3 + uVar38;
                auVar119._0_4_ = -(uint)(auVar100._0_4_ < (int)uVar38);
                auVar119._4_4_ = -(uint)(auVar100._4_4_ < iVar35 - open);
                auVar119._8_4_ = -(uint)(auVar100._8_4_ < (int)(uVar34 - iVar30));
                auVar119._12_4_ = -(uint)(auVar100._12_4_ < (int)uVar27);
                auVar79._0_4_ = uVar38 & auVar119._0_4_;
                auVar79._4_4_ = iVar35 - open & auVar119._4_4_;
                auVar79._8_4_ = uVar34 - iVar30 & auVar119._8_4_;
                auVar79._12_4_ = uVar27 & auVar119._12_4_;
                auVar79 = ~auVar119 & auVar100 | auVar79;
                iVar18 = 0;
                if ((auVar71 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  iVar19 = auVar79._0_2_;
                  if (s2_beg != 0) {
                    iVar19 = iVar18;
                  }
                  ptr_01[uVar37 + 1] = iVar19;
                }
                auVar123 = auVar122 & auVar125 | auVar123;
                auVar71 = packssdw(auVar123,auVar123);
                auVar14._8_4_ = 0xffffffff;
                auVar14._0_8_ = 0xffffffffffffffff;
                auVar14._12_4_ = 0xffffffff;
                auVar71 = packssdw(auVar71 ^ auVar14,auVar71 ^ auVar14);
                if ((auVar71._0_4_ >> 0x10 & 1) != 0) {
                  iVar19 = auVar79._4_2_;
                  if (s2_beg != 0) {
                    iVar19 = iVar18;
                  }
                  ptr_01[uVar37 + 2] = iVar19;
                }
                auVar71 = (auVar117 | _DAT_00903a80) ^ auVar64;
                auVar80._0_4_ = -(uint)(iVar87 < auVar71._0_4_);
                auVar80._4_4_ = -(uint)(iVar91 < auVar71._4_4_);
                auVar80._8_4_ = -(uint)(iVar94 < auVar71._8_4_);
                auVar80._12_4_ = -(uint)(iVar97 < auVar71._12_4_);
                auVar57._4_4_ = auVar80._0_4_;
                auVar57._0_4_ = auVar80._0_4_;
                auVar57._8_4_ = auVar80._8_4_;
                auVar57._12_4_ = auVar80._8_4_;
                auVar72._4_4_ = -(uint)(auVar71._4_4_ == iVar91);
                auVar72._12_4_ = -(uint)(auVar71._12_4_ == iVar97);
                auVar72._0_4_ = auVar72._4_4_;
                auVar72._8_4_ = auVar72._12_4_;
                auVar124._4_4_ = auVar80._4_4_;
                auVar124._0_4_ = auVar80._4_4_;
                auVar124._8_4_ = auVar80._12_4_;
                auVar124._12_4_ = auVar80._12_4_;
                auVar71 = packssdw(auVar80,auVar72 & auVar57 | auVar124);
                auVar15._8_4_ = 0xffffffff;
                auVar15._0_8_ = 0xffffffffffffffff;
                auVar15._12_4_ = 0xffffffff;
                auVar71 = packssdw(auVar71 ^ auVar15,auVar71 ^ auVar15);
                if ((auVar71 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  iVar19 = auVar79._8_2_;
                  if (s2_beg != 0) {
                    iVar19 = iVar18;
                  }
                  ptr_01[uVar37 + 3] = iVar19;
                }
                auVar71 = pshufhw(auVar57,auVar57,0x84);
                auVar123 = pshufhw(auVar72,auVar72,0x84);
                auVar56 = pshufhw(auVar71,auVar124,0x84);
                auVar58._8_4_ = 0xffffffff;
                auVar58._0_8_ = 0xffffffffffffffff;
                auVar58._12_4_ = 0xffffffff;
                auVar58 = (auVar56 | auVar123 & auVar71) ^ auVar58;
                auVar71 = packssdw(auVar58,auVar58);
                if ((auVar71 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  iVar19 = auVar79._12_2_;
                  if (s2_beg != 0) {
                    iVar19 = iVar18;
                  }
                  ptr_01[uVar37 + 4] = iVar19;
                }
                auVar73._4_4_ = uVar52;
                auVar73._0_4_ = uVar52;
                auVar73._8_4_ = uVar52;
                auVar73._12_4_ = uVar52;
                auVar73 = auVar73 | _DAT_00904a90;
                auVar103._4_4_ = gap;
                auVar103._0_4_ = gap;
                auVar103._8_4_ = gap;
                auVar103._12_4_ = gap;
                auVar104._0_8_ = (ulong)(uint)gap * (ulong)auVar73._4_4_;
                auVar104._8_8_ = (auVar103._8_8_ & 0xffffffff) * (ulong)auVar73._12_4_;
                auVar81._0_4_ = uVar34 - auVar73._0_4_ * gap;
                auVar81._4_4_ = uVar34 - (int)auVar104._0_8_;
                auVar81._8_4_ = uVar34 - (int)((auVar73._8_8_ & 0xffffffff) * (ulong)(uint)gap);
                auVar81._12_4_ = uVar34 - (int)auVar104._8_8_;
                auVar120._0_4_ = -(uint)(auVar100._0_4_ < auVar81._0_4_);
                auVar120._4_4_ = -(uint)(auVar100._4_4_ < auVar81._4_4_);
                auVar120._8_4_ = -(uint)(auVar100._8_4_ < auVar81._8_4_);
                auVar120._12_4_ = -(uint)(auVar100._12_4_ < auVar81._12_4_);
                in_XMM11 = ~auVar120 & auVar100 | auVar81 & auVar120;
                auVar71 = (auVar117 | _DAT_00903ad0) ^ auVar64;
                auVar82._0_4_ = -(uint)(iVar87 < auVar71._0_4_);
                auVar82._4_4_ = -(uint)(iVar91 < auVar71._4_4_);
                auVar82._8_4_ = -(uint)(iVar94 < auVar71._8_4_);
                auVar82._12_4_ = -(uint)(iVar97 < auVar71._12_4_);
                auVar74._4_4_ = auVar82._0_4_;
                auVar74._0_4_ = auVar82._0_4_;
                auVar74._8_4_ = auVar82._8_4_;
                auVar74._12_4_ = auVar82._8_4_;
                auVar56 = pshuflw(auVar104,auVar74,0xe8);
                auVar59._4_4_ = -(uint)(auVar71._4_4_ == iVar91);
                auVar59._12_4_ = -(uint)(auVar71._12_4_ == iVar97);
                auVar59._0_4_ = auVar59._4_4_;
                auVar59._8_4_ = auVar59._12_4_;
                auVar123 = pshuflw(auVar125,auVar59,0xe8);
                auVar60._4_4_ = auVar82._4_4_;
                auVar60._0_4_ = auVar82._4_4_;
                auVar60._8_4_ = auVar82._12_4_;
                auVar60._12_4_ = auVar82._12_4_;
                auVar71 = pshuflw(auVar82,auVar60,0xe8);
                auVar83._8_4_ = 0xffffffff;
                auVar83._0_8_ = 0xffffffffffffffff;
                auVar83._12_4_ = 0xffffffff;
                auVar83 = (auVar71 | auVar123 & auVar56) ^ auVar83;
                auVar71 = packssdw(auVar83,auVar83);
                if ((auVar71 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  iVar19 = in_XMM11._0_2_;
                  if (s2_beg != 0) {
                    iVar19 = iVar18;
                  }
                  ptr_01[uVar37 + 5] = iVar19;
                }
                auVar60 = auVar59 & auVar74 | auVar60;
                auVar71 = packssdw(auVar60,auVar60);
                auVar16._8_4_ = 0xffffffff;
                auVar16._0_8_ = 0xffffffffffffffff;
                auVar16._12_4_ = 0xffffffff;
                auVar71 = packssdw(auVar71 ^ auVar16,auVar71 ^ auVar16);
                if ((auVar71 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  iVar19 = in_XMM11._4_2_;
                  if (s2_beg != 0) {
                    iVar19 = iVar18;
                  }
                  ptr_01[uVar37 + 6] = iVar19;
                }
                auVar71 = (auVar117 | _DAT_00903ac0) ^ auVar64;
                auVar84._0_4_ = -(uint)(iVar87 < auVar71._0_4_);
                auVar84._4_4_ = -(uint)(iVar91 < auVar71._4_4_);
                auVar84._8_4_ = -(uint)(iVar94 < auVar71._8_4_);
                auVar84._12_4_ = -(uint)(iVar97 < auVar71._12_4_);
                auVar61._4_4_ = auVar84._0_4_;
                auVar61._0_4_ = auVar84._0_4_;
                auVar61._8_4_ = auVar84._8_4_;
                auVar61._12_4_ = auVar84._8_4_;
                iVar67 = -(uint)(auVar71._4_4_ == iVar91);
                iVar68 = -(uint)(auVar71._12_4_ == iVar97);
                auVar75._4_4_ = iVar67;
                auVar75._0_4_ = iVar67;
                auVar75._8_4_ = iVar68;
                auVar75._12_4_ = iVar68;
                auVar118._4_4_ = auVar84._4_4_;
                auVar118._0_4_ = auVar84._4_4_;
                auVar118._8_4_ = auVar84._12_4_;
                auVar118._12_4_ = auVar84._12_4_;
                auVar71 = packssdw(auVar84,auVar75 & auVar61 | auVar118);
                auVar17._8_4_ = 0xffffffff;
                auVar17._0_8_ = 0xffffffffffffffff;
                auVar17._12_4_ = 0xffffffff;
                auVar71 = packssdw(auVar71 ^ auVar17,auVar71 ^ auVar17);
                if ((auVar71 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  iVar19 = in_XMM11._8_2_;
                  if (s2_beg != 0) {
                    iVar19 = iVar18;
                  }
                  ptr_01[uVar37 + 7] = iVar19;
                }
                auVar56 = pshufhw(auVar61,auVar61,0x84);
                auVar76 = pshufhw(auVar75,auVar75,0x84);
                auVar123 = pshufhw(auVar56,auVar118,0x84);
                auVar62._8_4_ = 0xffffffff;
                auVar62._0_8_ = 0xffffffffffffffff;
                auVar62._12_4_ = 0xffffffff;
                auVar62 = (auVar123 | auVar76 & auVar56) ^ auVar62;
                auVar56 = packssdw(auVar62,auVar62);
                if ((auVar56 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  iVar19 = in_XMM11._12_2_;
                  if (s2_beg != 0) {
                    iVar19 = iVar18;
                  }
                  ptr_01[uVar37 + 8] = iVar19;
                }
                uVar37 = uVar37 + 8;
                iVar35 = iVar35 + gap * -8;
                uVar38 = uVar38 + gap * -8;
                iVar30 = iVar30 + gap * 8;
              } while ((s2Len + 7U & 0xfffffff8) != uVar37);
              uVar38 = (uint)uVar31;
              uVar37 = 0;
              local_88 = auVar55._0_2_;
              sStack_86 = auVar55._2_2_;
              auVar121._0_2_ = -(ushort)(local_88 == 7);
              auVar121._2_2_ = -(ushort)(sStack_86 == 6);
              auVar121._4_2_ = -(ushort)(local_88 == 5);
              auVar121._6_2_ = -(ushort)(sStack_86 == 4);
              auVar121._8_2_ = -(ushort)(local_88 == 3);
              auVar121._10_2_ = -(ushort)(sStack_86 == 2);
              auVar121._12_2_ = -(ushort)(local_88 == 1);
              auVar121._14_2_ = -(ushort)(sStack_86 == 0);
              auVar55._4_4_ = uVar51;
              auVar55._0_4_ = uVar51;
              auVar55._8_4_ = uVar51;
              auVar55._12_4_ = uVar51;
              local_78 = auVar54._0_2_;
              uStack_76 = auVar54._2_2_;
              auVar64 = auVar55;
              auVar100 = auVar55;
              iVar30 = iVar25;
              uVar86 = local_78;
              uVar89 = uStack_76;
              uVar90 = local_78;
              uVar92 = uStack_76;
              uVar93 = local_78;
              uVar95 = uStack_76;
              uVar96 = local_78;
              uVar98 = uStack_76;
              do {
                ptr_02 = ptr;
                ptr = palVar24;
                uVar29 = ptr[uVar38 - 1][0];
                iVar35 = ppVar5->mapper[(byte)s2[uVar37]];
                auVar99._8_8_ = ptr[uVar38 - 1][1] << 0x10 | uVar29 >> 0x30;
                auVar99._0_8_ = uVar29 << 0x10 | (ulong)(ushort)ptr_01[uVar37];
                lVar39 = 0;
                auVar63 = auVar55;
                auVar54 = auVar100;
                do {
                  auVar100 = paddsw(auVar99,*(undefined1 (*) [16])
                                             ((long)pvVar4 + lVar39 + (long)iVar35 * uVar31 * 0x10))
                  ;
                  auVar71 = *(undefined1 (*) [16])((long)*ptr_00 + lVar39);
                  sVar66 = auVar63._0_2_;
                  sVar45 = auVar71._0_2_;
                  uVar102 = (ushort)(sVar45 < sVar66) * sVar66 | (ushort)(sVar45 >= sVar66) * sVar45
                  ;
                  sVar116 = auVar63._2_2_;
                  sVar46 = auVar71._2_2_;
                  uVar106 = (ushort)(sVar46 < sVar116) * sVar116 |
                            (ushort)(sVar46 >= sVar116) * sVar46;
                  sVar6 = auVar63._4_2_;
                  sVar47 = auVar71._4_2_;
                  uVar107 = (ushort)(sVar47 < sVar6) * sVar6 | (ushort)(sVar47 >= sVar6) * sVar47;
                  sVar7 = auVar63._6_2_;
                  sVar48 = auVar71._6_2_;
                  uVar108 = (ushort)(sVar48 < sVar7) * sVar7 | (ushort)(sVar48 >= sVar7) * sVar48;
                  sVar8 = auVar63._8_2_;
                  sVar49 = auVar71._8_2_;
                  uVar109 = (ushort)(sVar49 < sVar8) * sVar8 | (ushort)(sVar49 >= sVar8) * sVar49;
                  sVar9 = auVar63._10_2_;
                  sVar50 = auVar71._10_2_;
                  uVar110 = (ushort)(sVar50 < sVar9) * sVar9 | (ushort)(sVar50 >= sVar9) * sVar50;
                  sVar10 = auVar63._12_2_;
                  sVar112 = auVar71._12_2_;
                  sVar114 = auVar71._14_2_;
                  uVar111 = (ushort)(sVar112 < sVar10) * sVar10 |
                            (ushort)(sVar112 >= sVar10) * sVar112;
                  sVar40 = auVar63._14_2_;
                  uVar113 = (ushort)(sVar114 < sVar40) * sVar40 |
                            (ushort)(sVar114 >= sVar40) * sVar114;
                  sVar69 = auVar100._0_2_;
                  auVar105._0_2_ =
                       (ushort)((short)uVar102 < sVar69) * sVar69 |
                       ((short)uVar102 >= sVar69) * uVar102;
                  sVar69 = auVar100._2_2_;
                  auVar105._2_2_ =
                       (ushort)((short)uVar106 < sVar69) * sVar69 |
                       ((short)uVar106 >= sVar69) * uVar106;
                  sVar69 = auVar100._4_2_;
                  auVar105._4_2_ =
                       (ushort)((short)uVar107 < sVar69) * sVar69 |
                       ((short)uVar107 >= sVar69) * uVar107;
                  sVar69 = auVar100._6_2_;
                  auVar105._6_2_ =
                       (ushort)((short)uVar108 < sVar69) * sVar69 |
                       ((short)uVar108 >= sVar69) * uVar108;
                  sVar69 = auVar100._8_2_;
                  auVar105._8_2_ =
                       (ushort)((short)uVar109 < sVar69) * sVar69 |
                       ((short)uVar109 >= sVar69) * uVar109;
                  sVar69 = auVar100._10_2_;
                  auVar105._10_2_ =
                       (ushort)((short)uVar110 < sVar69) * sVar69 |
                       ((short)uVar110 >= sVar69) * uVar110;
                  sVar69 = auVar100._12_2_;
                  auVar105._12_2_ =
                       (ushort)((short)uVar111 < sVar69) * sVar69 |
                       ((short)uVar111 >= sVar69) * uVar111;
                  sVar69 = auVar100._14_2_;
                  auVar105._14_2_ =
                       (ushort)((short)uVar113 < sVar69) * sVar69 |
                       ((short)uVar113 >= sVar69) * uVar113;
                  *(undefined1 (*) [16])((long)*ptr_02 + lVar39) = auVar105;
                  sVar69 = auVar54._0_2_;
                  auVar100._0_2_ =
                       (sVar69 < (short)auVar105._0_2_) * auVar105._0_2_ |
                       (ushort)(sVar69 >= (short)auVar105._0_2_) * sVar69;
                  sVar69 = auVar54._2_2_;
                  auVar100._2_2_ =
                       (sVar69 < (short)auVar105._2_2_) * auVar105._2_2_ |
                       (ushort)(sVar69 >= (short)auVar105._2_2_) * sVar69;
                  sVar69 = auVar54._4_2_;
                  auVar100._4_2_ =
                       (sVar69 < (short)auVar105._4_2_) * auVar105._4_2_ |
                       (ushort)(sVar69 >= (short)auVar105._4_2_) * sVar69;
                  sVar69 = auVar54._6_2_;
                  auVar100._6_2_ =
                       (sVar69 < (short)auVar105._6_2_) * auVar105._6_2_ |
                       (ushort)(sVar69 >= (short)auVar105._6_2_) * sVar69;
                  sVar69 = auVar54._8_2_;
                  auVar100._8_2_ =
                       (sVar69 < (short)auVar105._8_2_) * auVar105._8_2_ |
                       (ushort)(sVar69 >= (short)auVar105._8_2_) * sVar69;
                  sVar69 = auVar54._10_2_;
                  auVar100._10_2_ =
                       (sVar69 < (short)auVar105._10_2_) * auVar105._10_2_ |
                       (ushort)(sVar69 >= (short)auVar105._10_2_) * sVar69;
                  sVar69 = auVar54._12_2_;
                  sVar44 = auVar54._14_2_;
                  auVar100._12_2_ =
                       (sVar69 < (short)auVar105._12_2_) * auVar105._12_2_ |
                       (ushort)(sVar69 >= (short)auVar105._12_2_) * sVar69;
                  auVar100._14_2_ =
                       (sVar44 < (short)auVar105._14_2_) * auVar105._14_2_ |
                       (ushort)(sVar44 >= (short)auVar105._14_2_) * sVar44;
                  uVar86 = (ushort)(sVar45 < (short)uVar86) * sVar45 |
                           (sVar45 >= (short)uVar86) * uVar86;
                  uVar89 = (ushort)(sVar46 < (short)uVar89) * sVar46 |
                           (sVar46 >= (short)uVar89) * uVar89;
                  uVar90 = (ushort)(sVar47 < (short)uVar90) * sVar47 |
                           (sVar47 >= (short)uVar90) * uVar90;
                  uVar92 = (ushort)(sVar48 < (short)uVar92) * sVar48 |
                           (sVar48 >= (short)uVar92) * uVar92;
                  uVar93 = (ushort)(sVar49 < (short)uVar93) * sVar49 |
                           (sVar49 >= (short)uVar93) * uVar93;
                  uVar95 = (ushort)(sVar50 < (short)uVar95) * sVar50 |
                           (sVar50 >= (short)uVar95) * uVar95;
                  uVar96 = (ushort)(sVar112 < (short)uVar96) * sVar112 |
                           (sVar112 >= (short)uVar96) * uVar96;
                  uVar98 = (ushort)(sVar114 < (short)uVar98) * sVar114 |
                           (sVar114 >= (short)uVar98) * uVar98;
                  uVar86 = (ushort)(sVar66 < (short)uVar86) * sVar66 |
                           (sVar66 >= (short)uVar86) * uVar86;
                  uVar89 = (ushort)(sVar116 < (short)uVar89) * sVar116 |
                           (sVar116 >= (short)uVar89) * uVar89;
                  uVar90 = (ushort)(sVar6 < (short)uVar90) * sVar6 |
                           (sVar6 >= (short)uVar90) * uVar90;
                  uVar92 = (ushort)(sVar7 < (short)uVar92) * sVar7 |
                           (sVar7 >= (short)uVar92) * uVar92;
                  uVar93 = (ushort)(sVar8 < (short)uVar93) * sVar8 |
                           (sVar8 >= (short)uVar93) * uVar93;
                  uVar95 = (ushort)(sVar9 < (short)uVar95) * sVar9 |
                           (sVar9 >= (short)uVar95) * uVar95;
                  uVar96 = (ushort)(sVar10 < (short)uVar96) * sVar10 |
                           (sVar10 >= (short)uVar96) * uVar96;
                  uVar98 = (ushort)(sVar40 < (short)uVar98) * sVar40 |
                           (sVar40 >= (short)uVar98) * uVar98;
                  uVar86 = ((short)auVar105._0_2_ < (short)uVar86) * auVar105._0_2_ |
                           ((short)auVar105._0_2_ >= (short)uVar86) * uVar86;
                  uVar89 = ((short)auVar105._2_2_ < (short)uVar89) * auVar105._2_2_ |
                           ((short)auVar105._2_2_ >= (short)uVar89) * uVar89;
                  uVar90 = ((short)auVar105._4_2_ < (short)uVar90) * auVar105._4_2_ |
                           ((short)auVar105._4_2_ >= (short)uVar90) * uVar90;
                  uVar92 = ((short)auVar105._6_2_ < (short)uVar92) * auVar105._6_2_ |
                           ((short)auVar105._6_2_ >= (short)uVar92) * uVar92;
                  uVar93 = ((short)auVar105._8_2_ < (short)uVar93) * auVar105._8_2_ |
                           ((short)auVar105._8_2_ >= (short)uVar93) * uVar93;
                  uVar95 = ((short)auVar105._10_2_ < (short)uVar95) * auVar105._10_2_ |
                           ((short)auVar105._10_2_ >= (short)uVar95) * uVar95;
                  uVar96 = ((short)auVar105._12_2_ < (short)uVar96) * auVar105._12_2_ |
                           ((short)auVar105._12_2_ >= (short)uVar96) * uVar96;
                  uVar98 = ((short)auVar105._14_2_ < (short)uVar98) * auVar105._14_2_ |
                           ((short)auVar105._14_2_ >= (short)uVar98) * uVar98;
                  auVar88 = psubsw(auVar105,auVar70);
                  auVar11._4_4_ = uVar41;
                  auVar11._0_4_ = uVar41;
                  auVar11._8_4_ = uVar41;
                  auVar11._12_4_ = uVar41;
                  auVar54 = psubsw(auVar71,auVar11);
                  sVar66 = auVar88._0_2_;
                  sVar40 = auVar54._0_2_;
                  sVar69 = auVar88._2_2_;
                  sVar44 = auVar54._2_2_;
                  sVar116 = auVar88._4_2_;
                  sVar45 = auVar54._4_2_;
                  sVar6 = auVar88._6_2_;
                  sVar46 = auVar54._6_2_;
                  sVar7 = auVar88._8_2_;
                  sVar47 = auVar54._8_2_;
                  sVar8 = auVar88._10_2_;
                  sVar48 = auVar54._10_2_;
                  sVar9 = auVar88._12_2_;
                  sVar49 = auVar54._12_2_;
                  sVar50 = auVar54._14_2_;
                  sVar10 = auVar88._14_2_;
                  puVar1 = (ushort *)((long)*ptr_00 + lVar39);
                  *puVar1 = (ushort)(sVar40 < sVar66) * sVar66 | (ushort)(sVar40 >= sVar66) * sVar40
                  ;
                  puVar1[1] = (ushort)(sVar44 < sVar69) * sVar69 |
                              (ushort)(sVar44 >= sVar69) * sVar44;
                  puVar1[2] = (ushort)(sVar45 < sVar116) * sVar116 |
                              (ushort)(sVar45 >= sVar116) * sVar45;
                  puVar1[3] = (ushort)(sVar46 < sVar6) * sVar6 | (ushort)(sVar46 >= sVar6) * sVar46;
                  puVar1[4] = (ushort)(sVar47 < sVar7) * sVar7 | (ushort)(sVar47 >= sVar7) * sVar47;
                  puVar1[5] = (ushort)(sVar48 < sVar8) * sVar8 | (ushort)(sVar48 >= sVar8) * sVar48;
                  puVar1[6] = (ushort)(sVar49 < sVar9) * sVar9 | (ushort)(sVar49 >= sVar9) * sVar49;
                  puVar1[7] = (ushort)(sVar50 < sVar10) * sVar10 |
                              (ushort)(sVar50 >= sVar10) * sVar50;
                  auVar12._4_4_ = uVar41;
                  auVar12._0_4_ = uVar41;
                  auVar12._8_4_ = uVar41;
                  auVar12._12_4_ = uVar41;
                  auVar54 = psubsw(auVar63,auVar12);
                  sVar40 = auVar54._0_2_;
                  auVar63._0_2_ =
                       (ushort)(sVar40 < sVar66) * sVar66 | (ushort)(sVar40 >= sVar66) * sVar40;
                  sVar66 = auVar54._2_2_;
                  auVar63._2_2_ =
                       (ushort)(sVar66 < sVar69) * sVar69 | (ushort)(sVar66 >= sVar69) * sVar66;
                  sVar66 = auVar54._4_2_;
                  auVar63._4_2_ =
                       (ushort)(sVar66 < sVar116) * sVar116 | (ushort)(sVar66 >= sVar116) * sVar66;
                  sVar66 = auVar54._6_2_;
                  auVar63._6_2_ =
                       (ushort)(sVar66 < sVar6) * sVar6 | (ushort)(sVar66 >= sVar6) * sVar66;
                  sVar66 = auVar54._8_2_;
                  auVar63._8_2_ =
                       (ushort)(sVar66 < sVar7) * sVar7 | (ushort)(sVar66 >= sVar7) * sVar66;
                  sVar66 = auVar54._10_2_;
                  auVar63._10_2_ =
                       (ushort)(sVar66 < sVar8) * sVar8 | (ushort)(sVar66 >= sVar8) * sVar66;
                  sVar66 = auVar54._12_2_;
                  sVar69 = auVar54._14_2_;
                  auVar63._12_2_ =
                       (ushort)(sVar66 < sVar9) * sVar9 | (ushort)(sVar66 >= sVar9) * sVar66;
                  auVar63._14_2_ =
                       (ushort)(sVar69 < sVar10) * sVar10 | (ushort)(sVar69 >= sVar10) * sVar69;
                  auVar99 = *(undefined1 (*) [16])((long)*ptr + lVar39);
                  lVar39 = lVar39 + 0x10;
                  auVar54 = auVar100;
                } while (uVar31 << 4 != lVar39);
                iVar35 = 0;
                do {
                  uVar27 = uVar34;
                  if (s2_beg == 0) {
                    uVar27 = ptr_01[uVar37 + 1] - open;
                  }
                  uVar29 = (ulong)uVar27;
                  if ((int)uVar27 < -0x7fff) {
                    uVar29 = 0xffff8000;
                  }
                  uVar53 = auVar63._0_8_;
                  auVar63._8_8_ = auVar63._8_8_ << 0x10 | uVar53 >> 0x30;
                  auVar63._0_8_ = uVar53 << 0x10 | uVar29 & 0xffff;
                  lVar39 = 0;
                  auVar54 = auVar100;
                  do {
                    psVar2 = (short *)((long)*ptr_02 + lVar39);
                    sVar69 = *psVar2;
                    sVar116 = psVar2[1];
                    sVar6 = psVar2[2];
                    sVar7 = psVar2[3];
                    sVar8 = psVar2[4];
                    sVar9 = psVar2[5];
                    sVar10 = psVar2[6];
                    sVar40 = psVar2[7];
                    sVar66 = auVar63._0_2_;
                    auVar77._0_2_ =
                         (ushort)(sVar69 < sVar66) * sVar66 | (ushort)(sVar69 >= sVar66) * sVar69;
                    sVar66 = auVar63._2_2_;
                    auVar77._2_2_ =
                         (ushort)(sVar116 < sVar66) * sVar66 | (ushort)(sVar116 >= sVar66) * sVar116
                    ;
                    sVar66 = auVar63._4_2_;
                    auVar77._4_2_ =
                         (ushort)(sVar6 < sVar66) * sVar66 | (ushort)(sVar6 >= sVar66) * sVar6;
                    sVar66 = auVar63._6_2_;
                    auVar77._6_2_ =
                         (ushort)(sVar7 < sVar66) * sVar66 | (ushort)(sVar7 >= sVar66) * sVar7;
                    sVar66 = auVar63._8_2_;
                    auVar77._8_2_ =
                         (ushort)(sVar8 < sVar66) * sVar66 | (ushort)(sVar8 >= sVar66) * sVar8;
                    sVar66 = auVar63._10_2_;
                    auVar77._10_2_ =
                         (ushort)(sVar9 < sVar66) * sVar66 | (ushort)(sVar9 >= sVar66) * sVar9;
                    sVar66 = auVar63._12_2_;
                    auVar77._12_2_ =
                         (ushort)(sVar10 < sVar66) * sVar66 | (ushort)(sVar10 >= sVar66) * sVar10;
                    sVar66 = auVar63._14_2_;
                    auVar77._14_2_ =
                         (ushort)(sVar40 < sVar66) * sVar66 | (ushort)(sVar40 >= sVar66) * sVar40;
                    *(undefined1 (*) [16])((long)*ptr_02 + lVar39) = auVar77;
                    uVar86 = ((short)auVar77._0_2_ < (short)uVar86) * auVar77._0_2_ |
                             ((short)auVar77._0_2_ >= (short)uVar86) * uVar86;
                    uVar89 = ((short)auVar77._2_2_ < (short)uVar89) * auVar77._2_2_ |
                             ((short)auVar77._2_2_ >= (short)uVar89) * uVar89;
                    uVar90 = ((short)auVar77._4_2_ < (short)uVar90) * auVar77._4_2_ |
                             ((short)auVar77._4_2_ >= (short)uVar90) * uVar90;
                    uVar92 = ((short)auVar77._6_2_ < (short)uVar92) * auVar77._6_2_ |
                             ((short)auVar77._6_2_ >= (short)uVar92) * uVar92;
                    uVar93 = ((short)auVar77._8_2_ < (short)uVar93) * auVar77._8_2_ |
                             ((short)auVar77._8_2_ >= (short)uVar93) * uVar93;
                    uVar95 = ((short)auVar77._10_2_ < (short)uVar95) * auVar77._10_2_ |
                             ((short)auVar77._10_2_ >= (short)uVar95) * uVar95;
                    uVar96 = ((short)auVar77._12_2_ < (short)uVar96) * auVar77._12_2_ |
                             ((short)auVar77._12_2_ >= (short)uVar96) * uVar96;
                    uVar98 = ((short)auVar77._14_2_ < (short)uVar98) * auVar77._14_2_ |
                             ((short)auVar77._14_2_ >= (short)uVar98) * uVar98;
                    sVar66 = auVar54._0_2_;
                    auVar100._0_2_ =
                         (sVar66 < (short)auVar77._0_2_) * auVar77._0_2_ |
                         (ushort)(sVar66 >= (short)auVar77._0_2_) * sVar66;
                    sVar66 = auVar54._2_2_;
                    auVar100._2_2_ =
                         (sVar66 < (short)auVar77._2_2_) * auVar77._2_2_ |
                         (ushort)(sVar66 >= (short)auVar77._2_2_) * sVar66;
                    sVar66 = auVar54._4_2_;
                    auVar100._4_2_ =
                         (sVar66 < (short)auVar77._4_2_) * auVar77._4_2_ |
                         (ushort)(sVar66 >= (short)auVar77._4_2_) * sVar66;
                    sVar66 = auVar54._6_2_;
                    auVar100._6_2_ =
                         (sVar66 < (short)auVar77._6_2_) * auVar77._6_2_ |
                         (ushort)(sVar66 >= (short)auVar77._6_2_) * sVar66;
                    sVar66 = auVar54._8_2_;
                    auVar100._8_2_ =
                         (sVar66 < (short)auVar77._8_2_) * auVar77._8_2_ |
                         (ushort)(sVar66 >= (short)auVar77._8_2_) * sVar66;
                    sVar66 = auVar54._10_2_;
                    auVar100._10_2_ =
                         (sVar66 < (short)auVar77._10_2_) * auVar77._10_2_ |
                         (ushort)(sVar66 >= (short)auVar77._10_2_) * sVar66;
                    sVar66 = auVar54._12_2_;
                    sVar69 = auVar54._14_2_;
                    auVar100._12_2_ =
                         (sVar66 < (short)auVar77._12_2_) * auVar77._12_2_ |
                         (ushort)(sVar66 >= (short)auVar77._12_2_) * sVar66;
                    auVar100._14_2_ =
                         (sVar69 < (short)auVar77._14_2_) * auVar77._14_2_ |
                         (ushort)(sVar69 >= (short)auVar77._14_2_) * sVar69;
                    auVar54 = psubsw(auVar77,auVar70);
                    auVar13._4_4_ = uVar41;
                    auVar13._0_4_ = uVar41;
                    auVar13._8_4_ = uVar41;
                    auVar13._12_4_ = uVar41;
                    auVar63 = psubsw(auVar63,auVar13);
                    auVar101._0_2_ = -(ushort)(auVar54._0_2_ < auVar63._0_2_);
                    auVar101._2_2_ = -(ushort)(auVar54._2_2_ < auVar63._2_2_);
                    auVar101._4_2_ = -(ushort)(auVar54._4_2_ < auVar63._4_2_);
                    auVar101._6_2_ = -(ushort)(auVar54._6_2_ < auVar63._6_2_);
                    auVar101._8_2_ = -(ushort)(auVar54._8_2_ < auVar63._8_2_);
                    auVar101._10_2_ = -(ushort)(auVar54._10_2_ < auVar63._10_2_);
                    auVar101._12_2_ = -(ushort)(auVar54._12_2_ < auVar63._12_2_);
                    auVar101._14_2_ = -(ushort)(auVar54._14_2_ < auVar63._14_2_);
                    if ((((((((((((((((auVar101 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar101 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar101 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar101 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar101 >> 0x27 & (undefined1  [16])0x1) ==
                                  (undefined1  [16])0x0) &&
                                 (auVar101 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                 ) && (auVar101 >> 0x37 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                               (auVar101 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                              && (auVar101 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                              ) && (auVar101 >> 0x4f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                            (auVar101 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar101 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar101 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar101 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar101._14_2_ >> 7 & 1) == 0) && (auVar101._14_2_ & 0x8000) == 0)
                    goto LAB_00578171;
                    lVar39 = lVar39 + 0x10;
                    auVar54 = auVar100;
                  } while (uVar31 << 4 != lVar39);
                  iVar35 = iVar35 + 1;
                } while (iVar35 != 8);
LAB_00578171:
                palVar24 = ptr_02 + uVar42;
                sVar66 = (short)(*palVar24)[0];
                sVar69 = *(short *)((long)*palVar24 + 2);
                sVar116 = *(short *)((long)*palVar24 + 4);
                sVar6 = *(short *)((long)*palVar24 + 6);
                sVar7 = (short)(*palVar24)[1];
                sVar8 = *(short *)((long)*palVar24 + 10);
                sVar9 = *(short *)((long)*palVar24 + 0xc);
                sVar10 = *(short *)((long)*palVar24 + 0xe);
                sVar40 = auVar64._0_2_;
                auVar78._0_2_ = -(ushort)(sVar40 < sVar66);
                sVar44 = auVar64._2_2_;
                auVar78._2_2_ = -(ushort)(sVar44 < sVar69);
                sVar45 = auVar64._4_2_;
                auVar78._4_2_ = -(ushort)(sVar45 < sVar116);
                sVar46 = auVar64._6_2_;
                auVar78._6_2_ = -(ushort)(sVar46 < sVar6);
                sVar47 = auVar64._8_2_;
                auVar78._8_2_ = -(ushort)(sVar47 < sVar7);
                sVar48 = auVar64._10_2_;
                auVar78._10_2_ = -(ushort)(sVar48 < sVar8);
                sVar49 = auVar64._12_2_;
                auVar78._12_2_ = -(ushort)(sVar49 < sVar9);
                sVar50 = auVar64._14_2_;
                auVar78._14_2_ = -(ushort)(sVar50 < sVar10);
                auVar78 = auVar78 & auVar121;
                if ((((((((((((((((auVar78 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar78 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar78 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar78 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar78 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar78 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar78 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar78 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar78 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar78 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar78 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar78 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar78 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar78 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar78 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar78[0xf] < '\0') {
                  iVar30 = (int)uVar37;
                }
                auVar64._0_2_ =
                     (ushort)(sVar66 < sVar40) * sVar40 | (ushort)(sVar66 >= sVar40) * sVar66;
                auVar64._2_2_ =
                     (ushort)(sVar69 < sVar44) * sVar44 | (ushort)(sVar69 >= sVar44) * sVar69;
                auVar64._4_2_ =
                     (ushort)(sVar116 < sVar45) * sVar45 | (ushort)(sVar116 >= sVar45) * sVar116;
                auVar64._6_2_ =
                     (ushort)(sVar6 < sVar46) * sVar46 | (ushort)(sVar6 >= sVar46) * sVar6;
                auVar64._8_2_ =
                     (ushort)(sVar7 < sVar47) * sVar47 | (ushort)(sVar7 >= sVar47) * sVar7;
                auVar64._10_2_ =
                     (ushort)(sVar8 < sVar48) * sVar48 | (ushort)(sVar8 >= sVar48) * sVar8;
                auVar64._12_2_ =
                     (ushort)(sVar9 < sVar49) * sVar49 | (ushort)(sVar9 >= sVar49) * sVar9;
                auVar64._14_2_ =
                     (ushort)(sVar10 < sVar50) * sVar50 | (ushort)(sVar10 >= sVar50) * sVar10;
                uVar37 = uVar37 + 1;
                palVar24 = ptr_02;
                if (uVar37 == (uint)s2Len) {
                  if (s2_end != 0) {
                    if (iVar21 < 7) {
                      iVar35 = 0;
                      auVar54 = auVar64;
                      do {
                        auVar65._0_8_ = auVar54._0_8_ << 0x10;
                        auVar65._8_8_ = auVar54._8_8_ << 0x10 | auVar54._0_8_ >> 0x30;
                        auVar64._14_2_ = auVar54._12_2_;
                        iVar35 = iVar35 + 1;
                        auVar54 = auVar65;
                      } while (iVar35 < (int)uVar26);
                    }
                    uVar22 = (uint)auVar64._14_2_;
                  }
                  sVar66 = (short)uVar22;
                  uVar34 = uVar20;
                  if ((s1_end != 0) && (((ulong)uVar3 + 7 & 0x7ffffff8) != 0)) {
                    uVar31 = 0;
                    do {
                      uVar27 = ((uint)uVar31 & 7) * uVar38 + ((uint)(uVar31 >> 3) & 0x1fffffff);
                      if ((int)uVar27 < (int)uVar3) {
                        auVar64._14_2_ = *(ushort *)((long)*ptr_02 + uVar31 * 2);
                        if ((short)(ushort)uVar22 < (short)auVar64._14_2_) {
                          uVar22 = (uint)auVar64._14_2_;
                          iVar30 = iVar25;
                          uVar34 = uVar27;
                        }
                        else {
                          if ((int)uVar34 <= (int)uVar27) {
                            uVar27 = uVar34;
                          }
                          if (iVar30 != iVar25) {
                            uVar27 = uVar34;
                          }
                          if (auVar64._14_2_ == (ushort)uVar22) {
                            uVar34 = uVar27;
                          }
                        }
                      }
                      sVar66 = (short)uVar22;
                      uVar31 = uVar31 + 1;
                    } while ((uVar38 & 0xfffffff) << 3 != (int)uVar31);
                  }
                  if (s2_end == 0 && s1_end == 0) {
                    uVar31 = ptr_02[uVar42][1];
                    if (iVar21 < 7) {
                      iVar30 = 0;
                      uVar42 = ptr_02[uVar42][0];
                      do {
                        uVar31 = uVar31 << 0x10 | uVar42 >> 0x30;
                        iVar30 = iVar30 + 1;
                        uVar42 = uVar42 << 0x10;
                      } while (iVar30 < (int)uVar26);
                    }
                    sVar66 = (short)(uVar31 >> 0x30);
                    iVar30 = iVar25;
                    uVar34 = uVar20;
                  }
                  sVar69 = auVar43._0_2_;
                  auVar115._0_2_ = -(ushort)((short)uVar86 < sVar69);
                  sVar116 = auVar43._2_2_;
                  auVar115._2_2_ = -(ushort)((short)uVar89 < sVar116);
                  auVar115._4_2_ = -(ushort)((short)uVar90 < sVar69);
                  auVar115._6_2_ = -(ushort)((short)uVar92 < sVar116);
                  auVar115._8_2_ = -(ushort)((short)uVar93 < sVar69);
                  auVar115._10_2_ = -(ushort)((short)uVar95 < sVar116);
                  auVar115._12_2_ = -(ushort)((short)uVar96 < sVar69);
                  auVar115._14_2_ = -(ushort)((short)uVar98 < sVar116);
                  auVar85._0_2_ = -(ushort)((short)local_78 < (short)auVar100._0_2_);
                  auVar85._2_2_ = -(ushort)((short)uStack_76 < (short)auVar100._2_2_);
                  auVar85._4_2_ = -(ushort)((short)local_78 < (short)auVar100._4_2_);
                  auVar85._6_2_ = -(ushort)((short)uStack_76 < (short)auVar100._6_2_);
                  auVar85._8_2_ = -(ushort)((short)local_78 < (short)auVar100._8_2_);
                  auVar85._10_2_ = -(ushort)((short)uStack_76 < (short)auVar100._10_2_);
                  auVar85._12_2_ = -(ushort)((short)local_78 < (short)auVar100._12_2_);
                  auVar85._14_2_ = -(ushort)((short)uStack_76 < (short)auVar100._14_2_);
                  auVar85 = auVar85 | auVar115;
                  if ((((((((((((((((auVar85 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar85 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar85 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar85 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar85 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar85 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar85 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar85 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar85 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar85 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar85 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar85 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar85 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar85 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar85 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar85[0xf] < '\0') {
                    *(byte *)&ppVar23->flag = (byte)ppVar23->flag | 0x40;
                    sVar66 = 0;
                    iVar30 = 0;
                    uVar34 = 0;
                  }
                  ppVar23->score = (int)sVar66;
                  ppVar23->end_query = uVar34;
                  ppVar23->end_ref = iVar30;
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(ptr);
                  parasail_free(ptr_02);
                  return ppVar23;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi16(_mm_set1_epi16(position),
            _mm_set_epi16(0,1,2,3,4,5,6,7));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 2);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi16(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi16(vH, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_subs_epi16(vH, vGapO);
            vE = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            vF = _mm_slli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_subs_epi16(vH, vGapO);
                vF = _mm_subs_epi16(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi16(vF, vH))) goto end;
                /*vF = _mm_max_epi16(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m128i vCompare;
            vH = _mm_load_si128(pvHStore + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi16(vH, vMaxH));
            vMaxH = _mm_max_epi16(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 2);
        }
        score = (int16_t) _mm_extract_epi16(vMaxH, 7);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int16_t *t = (int16_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            score = (int16_t) _mm_extract_epi16 (vH, 7);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}